

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O3

void __thiscall
wabt::BinaryReaderLogging::LogTypes(BinaryReaderLogging *this,Index type_count,Type *types)

{
  ulong uVar1;
  
  Stream::Writef(this->stream_,"[");
  if (type_count != 0) {
    uVar1 = 0;
    do {
      LogType(this,(Type)types[uVar1].enum_);
      if (type_count - 1 != uVar1) {
        Stream::Writef(this->stream_,", ");
      }
      uVar1 = uVar1 + 1;
    } while (type_count != uVar1);
  }
  Stream::Writef(this->stream_,"]");
  return;
}

Assistant:

void BinaryReaderLogging::LogTypes(Index type_count, Type* types) {
  LOGF_NOINDENT("[");
  for (Index i = 0; i < type_count; ++i) {
    LogType(types[i]);
    if (i != type_count - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("]");
}